

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O2

int Saig_ManRetimeSteps(Aig_Man_t *p,int nSteps,int fForward,int fAddBugs)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  Aig_ManSetCioIds(p);
  Aig_ManFanoutStart(p);
  p->fCreatePios = 1;
  if (fForward == 0) {
    iVar4 = 0;
    if (nSteps < 1) {
      nSteps = 0;
    }
    for (; iVar5 = nSteps, iVar4 != nSteps; iVar4 = iVar4 + 1) {
      for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar6);
        pAVar3 = Saig_ManRetimeNodeBwd(p,pAVar2);
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          Aig_ObjReplace(p,pAVar2,pAVar3,0);
          break;
        }
      }
      iVar5 = iVar4;
      if (p->vObjs->nSize == iVar6) break;
    }
  }
  else {
    Saig_ManMarkAutonomous(p);
    iVar4 = 0;
    if (nSteps < 1) {
      nSteps = 0;
      iVar4 = 0;
    }
    for (; iVar5 = nSteps, iVar4 != nSteps; iVar4 = iVar4 + 1) {
      iVar6 = 0;
      while( true ) {
        iVar1 = p->vObjs->nSize;
        if (iVar1 <= iVar6) break;
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
        if (((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7))
           && (pAVar3 = Saig_ManRetimeNodeFwd(p,pAVar2,(uint)(iVar4 == 10 && fAddBugs != 0)),
              pAVar3 != (Aig_Obj_t *)0x0)) {
          Aig_ObjReplace(p,pAVar2,pAVar3,0);
          iVar1 = p->vObjs->nSize;
          break;
        }
        iVar6 = iVar6 + 1;
      }
      iVar5 = iVar4;
      if (iVar1 == iVar6) break;
    }
  }
  p->fCreatePios = 0;
  Aig_ManFanoutStop(p);
  iVar4 = Aig_ManCleanup(p);
  if (iVar4 != 0) {
    __assert_fail("RetValue == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetStep.c"
                  ,0xe1,"int Saig_ManRetimeSteps(Aig_Man_t *, int, int, int)");
  }
  Aig_ManSetRegNum(p,p->nRegs);
  return iVar5;
}

Assistant:

int Saig_ManRetimeSteps( Aig_Man_t * p, int nSteps, int fForward, int fAddBugs )
{
    Aig_Obj_t * pObj, * pObjNew;
    int RetValue, s, i;
    Aig_ManSetCioIds( p );
    Aig_ManFanoutStart( p );
    p->fCreatePios = 1;
    if ( fForward )
    {
        Saig_ManMarkAutonomous( p );
        for ( s = 0; s < nSteps; s++ )
        {
            Aig_ManForEachNode( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, fAddBugs && (s == 10) );
//                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, 0 );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    else
    {
        for ( s = 0; s < nSteps; s++ )
        {
            Saig_ManForEachLo( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeBwd( p, pObj );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    p->fCreatePios = 0;
    Aig_ManFanoutStop( p );
    RetValue = Aig_ManCleanup( p );
    assert( RetValue == 0 );
    Aig_ManSetRegNum( p, p->nRegs ); 
    return s;
}